

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O0

void h262_print_macroblock(h262_seqparm *seqparm,h262_picparm *picparm,h262_macroblock *mb,int addr)

{
  uint32_t uVar1;
  int local_44;
  uint local_40;
  int j;
  int t;
  int s;
  int r;
  int dmv;
  int mfs;
  int mvc;
  int i;
  int addr_local;
  h262_macroblock *mb_local;
  h262_picparm *picparm_local;
  h262_seqparm *seqparm_local;
  
  printf("\tMacroblock %d: (%d, %d)\n",(ulong)(uint)addr,
         (ulong)((uint)addr % picparm->pic_width_in_mbs),
         (ulong)(uint)addr / (ulong)picparm->pic_width_in_mbs);
  printf("\t\tmacroblock_flags =");
  if (mb->macroblock_skipped != 0) {
    printf(" SKIP");
  }
  if (mb->macroblock_quant != 0) {
    printf(" QUANT");
  }
  if (mb->macroblock_motion_forward != 0) {
    printf(" FWD");
  }
  if (mb->macroblock_motion_backward != 0) {
    printf(" BWD");
  }
  if (mb->macroblock_pattern != 0) {
    printf(" PATTERN");
  }
  if (mb->macroblock_intra != 0) {
    printf(" INTRA");
  }
  printf("\n");
  if (mb->macroblock_intra == 0) {
    if (picparm->picture_structure == 3) {
      printf("\t\tframe_motion_type = %d [%s]\n",(ulong)mb->frame_motion_type,
             h262_print_macroblock::frpms[mb->frame_motion_type]);
    }
    else {
      printf("\t\tfield_motion_type = %d [%s]\n",(ulong)mb->field_motion_type,
             h262_print_macroblock::fipms[mb->field_motion_type]);
    }
  }
  if ((mb->macroblock_intra != 0) || (mb->macroblock_pattern != 0)) {
    printf("\t\tdct_type = %d\n",(ulong)mb->dct_type);
  }
  printf("\t\tquantiser_scale_code = %d\n",(ulong)mb->quantiser_scale_code);
  if ((mb->macroblock_intra == 0) && (mb->macroblock_skipped == 0)) {
    if (picparm->picture_structure == 3) {
      uVar1 = mb->frame_motion_type;
      if (uVar1 == 1) {
        dmv = 2;
        r = 1;
        s = 0;
      }
      else if (uVar1 == 2) {
        dmv = 1;
        r = 0;
        s = 0;
      }
      else if (uVar1 == 3) {
        dmv = 1;
        r = 0;
        s = 1;
      }
      else {
        dmv = 0;
      }
    }
    else {
      uVar1 = mb->field_motion_type;
      if (uVar1 == 1) {
        dmv = 1;
        r = 1;
        s = 0;
      }
      else if (uVar1 == 2) {
        dmv = 2;
        r = 1;
        s = 0;
      }
      else if (uVar1 == 3) {
        dmv = 1;
        r = 0;
        s = 1;
      }
      else {
        dmv = 0;
      }
    }
    for (t = 0; t < dmv; t = t + 1) {
      for (j = 0; j < 2; j = j + 1) {
        if (((j != 0) || (mb->macroblock_motion_forward != 0)) &&
           ((j != 1 || (mb->macroblock_motion_backward != 0)))) {
          if (r != 0) {
            printf("\t\tmotion_vertical_field_select[%d][%d] = %d\n",(ulong)(uint)t,(ulong)(uint)j,
                   (ulong)mb->motion_vertical_field_select[t][j]);
          }
          for (local_40 = 0; (int)local_40 < 2; local_40 = local_40 + 1) {
            printf("\t\tmotion_code[%d][%d][%d] = %d\n",(ulong)(uint)t,(ulong)(uint)j,
                   (ulong)local_40,(ulong)mb->motion_code[t][j][(int)local_40]);
            printf("\t\tmotion_residual[%d][%d][%d] = %d\n",(ulong)(uint)t,(ulong)(uint)j,
                   (ulong)local_40,(ulong)mb->motion_residual[t][j][(int)local_40]);
            if (s != 0) {
              printf("\t\tdmvector[%d] = %d\n",(ulong)local_40,(ulong)mb->dmvector[(int)local_40]);
            }
          }
        }
      }
    }
  }
  printf("\t\tcoded_block_pattern = 0x%x\n",(ulong)mb->coded_block_pattern);
  for (mfs = 0; mfs < h262_print_macroblock::block_count[seqparm->chroma_format]; mfs = mfs + 1) {
    printf("\t\tBlock %d:",(ulong)(uint)mfs);
    for (local_44 = 0; local_44 < 0x40; local_44 = local_44 + 1) {
      printf(" %d",(ulong)(uint)mb->block[mfs][local_44]);
    }
    printf("\n");
  }
  return;
}

Assistant:

void h262_print_macroblock(struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, int addr) {
	int i;
	static const int block_count[4] = { 4, 6, 8, 12 };
	static const char *const frpms[] = { "???", "field", "frame", "dual-prime" };
	static const char *const fipms[] = { "???", "field", "16x8", "dual-prime" };
	printf("\tMacroblock %d: (%d, %d)\n", addr, addr % picparm->pic_width_in_mbs, addr / picparm->pic_width_in_mbs);
	printf("\t\tmacroblock_flags =");
	if (mb->macroblock_skipped)
		printf(" SKIP");
	if (mb->macroblock_quant)
		printf(" QUANT");
	if (mb->macroblock_motion_forward)
		printf(" FWD");
	if (mb->macroblock_motion_backward)
		printf(" BWD");
	if (mb->macroblock_pattern)
		printf(" PATTERN");
	if (mb->macroblock_intra)
		printf(" INTRA");
	printf("\n");
	if (!mb->macroblock_intra) {
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			printf("\t\tframe_motion_type = %d [%s]\n", mb->frame_motion_type, frpms[mb->frame_motion_type]);
		} else {
			printf("\t\tfield_motion_type = %d [%s]\n", mb->field_motion_type, fipms[mb->field_motion_type]);
		}
	}
	if (mb->macroblock_intra || mb->macroblock_pattern)
		printf("\t\tdct_type = %d\n", mb->dct_type);
	printf("\t\tquantiser_scale_code = %d\n", mb->quantiser_scale_code);
	if (!mb->macroblock_intra && !mb->macroblock_skipped) {
		int mvc, mfs, dmv;
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			switch (mb->frame_motion_type) {
				case H262_FRAME_MOTION_FIELD:
					mvc = 2;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FRAME_MOTION_FRAME:
					mvc = 1;
					mfs = 0;
					dmv = 0;
					break;
				case H262_FRAME_MOTION_DUAL_PRIME:
					mvc = 1;
					mfs = 0;
					dmv = 1;
					break;
				default:
					mvc = 0;
			}
		} else {
			switch (mb->field_motion_type) {
				case H262_FIELD_MOTION_FIELD:
					mvc = 1;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FIELD_MOTION_16X8:
					mvc = 2;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FIELD_MOTION_DUAL_PRIME:
					mvc = 1;
					mfs = 0;
					dmv = 1;
					break;
				default:
					mvc = 0;
			}
		}
		int r, s, t;
		for (r = 0; r < mvc; r++) {
			for (s = 0; s < 2; s++) {
				if (s == 0 && !mb->macroblock_motion_forward)
					continue;
				if (s == 1 && !mb->macroblock_motion_backward)
					continue;
				if (mfs)
					printf("\t\tmotion_vertical_field_select[%d][%d] = %d\n", r, s, mb->motion_vertical_field_select[r][s]);
				for (t = 0; t < 2; t++) {
					printf("\t\tmotion_code[%d][%d][%d] = %d\n", r, s, t, mb->motion_code[r][s][t]);
					printf("\t\tmotion_residual[%d][%d][%d] = %d\n", r, s, t, mb->motion_residual[r][s][t]);
					if (dmv)
						printf("\t\tdmvector[%d] = %d\n", t, mb->dmvector[t]);
				}
			}
		}
	}
	printf("\t\tcoded_block_pattern = 0x%x\n", mb->coded_block_pattern);
	for (i = 0; i < block_count[seqparm->chroma_format]; i++) {
		printf("\t\tBlock %d:", i);
		int j;
		for (j = 0; j < 64; j++)
			printf(" %d", mb->block[i][j]);
		printf("\n");
	}
}